

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::DisneyMaterial::DisneyMaterial(DisneyMaterial *this,string *name)

{
  Material *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffe8;
  
  Material::Material(in_RSI,in_stack_ffffffffffffffe8);
  *in_RDI = &PTR_toString_abi_cxx11__00220420;
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 8) = 0x3f800000;
  math::vec3f::vec3f((vec3f *)((long)in_RDI + 0x44),0.5,0.5,0.5);
  *(undefined4 *)(in_RDI + 10) = 0x3f800000;
  *(undefined4 *)((long)in_RDI + 0x54) = 0x3fc00000;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0x3f000000;
  *(undefined4 *)((long)in_RDI + 100) = 0;
  *(undefined4 *)(in_RDI + 0xd) = 0x3f000000;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  *(undefined1 *)((long)in_RDI + 0x74) = 0;
  return;
}

Assistant:

DisneyMaterial(const std::string &name = "") : Material(name) {}